

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uchar *puVar6;
  size_t nblimbs;
  
  nblimbs = ((buflen >> 3) + 1) - (ulong)((buflen & 7) == 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  iVar3 = mbedtls_mpi_grow(X,1);
  if (iVar3 == 0) {
    iVar3 = 0;
    memset(X->p,0,X->n << 3);
    pmVar2 = X->p;
    *pmVar2 = 0;
    X->s = 1;
    if (buflen != 0) {
      puVar6 = buf + -1;
      iVar3 = 0;
      bVar4 = 0;
      uVar5 = 0;
      do {
        puVar1 = (ulong *)((long)pmVar2 + (uVar5 & 0xfffffffffffffff8));
        *puVar1 = *puVar1 | (ulong)puVar6[buflen] << (bVar4 & 0x38);
        uVar5 = uVar5 + 1;
        bVar4 = bVar4 + 8;
        puVar6 = puVar6 + -1;
      } while (buflen != uVar5);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j;
    size_t const limbs = CHARS_TO_LIMBS( buflen );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > 0; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}